

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O0

JsTypeValueInfo * __thiscall
GlobOptBlockData::MergeJsTypeValueInfo
          (GlobOptBlockData *this,JsTypeValueInfo *toValueInfo,JsTypeValueInfo *fromValueInfo,
          bool isLoopBackEdge,bool sameValueNumber)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  bool local_a1;
  EquivalentTypeSet *local_90;
  JsTypeValueInfo *mergedValueInfo;
  EquivalentTypeSet *local_60;
  EquivalentTypeSet *mergedTypeSet;
  EquivalentTypeSet *fromTypeSet;
  EquivalentTypeSet *toTypeSet;
  JITTypeHolder mergedType;
  JITTypeHolder fromType;
  JITTypeHolder toType;
  bool sameValueNumber_local;
  bool isLoopBackEdge_local;
  JsTypeValueInfo *fromValueInfo_local;
  JsTypeValueInfo *toValueInfo_local;
  GlobOptBlockData *this_local;
  
  if ((isLoopBackEdge) && (!sameValueNumber)) {
    return (JsTypeValueInfo *)0x0;
  }
  if (toValueInfo == fromValueInfo) {
    return toValueInfo;
  }
  fromType = JsTypeValueInfo::GetJsType(toValueInfo);
  mergedType = JsTypeValueInfo::GetJsType(fromValueInfo);
  bVar1 = JITTypeHolderBase<void>::operator==(&fromType,&mergedType);
  if (bVar1) {
    toTypeSet = (EquivalentTypeSet *)fromType.t;
  }
  else {
    JITTypeHolderBase<void>::JITTypeHolderBase((JITTypeHolderBase<void> *)&toTypeSet,(JITType *)0x0)
    ;
  }
  fromTypeSet = JsTypeValueInfo::GetJsTypeSet(toValueInfo);
  mergedTypeSet = JsTypeValueInfo::GetJsTypeSet(fromValueInfo);
  if (((fromTypeSet == (EquivalentTypeSet *)0x0) || (mergedTypeSet == (EquivalentTypeSet *)0x0)) ||
     (bVar1 = Js::EquivalentTypeSet::AreIdentical(fromTypeSet,mergedTypeSet), !bVar1)) {
    local_90 = (EquivalentTypeSet *)0x0;
  }
  else {
    local_90 = fromTypeSet;
  }
  local_60 = local_90;
  uVar2 = Func::GetSourceContextId(this->globOpt->func);
  uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar2,uVar3);
  if (!bVar1) {
    uVar2 = Func::GetSourceContextId(this->globOpt->func);
    uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar2,uVar3);
    if (!bVar1) goto LAB_005f32bd;
  }
  Output::Print(L"ObjTypeSpec: Merging type value info:\n");
  bVar1 = JsTypeValueInfo::GetIsShared(fromValueInfo);
  Output::Print(L"    from (shared %d): ",(ulong)bVar1);
  ValueInfo::Dump(&fromValueInfo->super_ValueInfo);
  bVar1 = JsTypeValueInfo::GetIsShared(toValueInfo);
  Output::Print(L"\n    to (shared %d): ",(ulong)bVar1);
  ValueInfo::Dump(&toValueInfo->super_ValueInfo);
LAB_005f32bd:
  bVar1 = JITTypeHolderBase<void>::operator==((JITTypeHolderBase<void> *)&toTypeSet,&fromType);
  this_local = (GlobOptBlockData *)toValueInfo;
  if ((bVar1) && (local_60 == fromTypeSet)) {
    uVar2 = Func::GetSourceContextId(this->globOpt->func);
    uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar2,uVar3);
    if (!bVar1) {
      uVar2 = Func::GetSourceContextId(this->globOpt->func);
      uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar2,uVar3);
      if (!bVar1) {
        return toValueInfo;
      }
    }
    bVar1 = JsTypeValueInfo::GetIsShared(toValueInfo);
    Output::Print(L"\n    result (shared %d): ",(ulong)bVar1);
    ValueInfo::Dump(&toValueInfo->super_ValueInfo);
    Output::Print(L"\n");
  }
  else {
    mergedValueInfo = (JsTypeValueInfo *)0x0;
    local_a1 = JITTypeHolderBase<void>::operator==
                         ((JITTypeHolderBase<void> *)&toTypeSet,&mergedValueInfo);
    local_a1 = local_a1 && local_60 == (EquivalentTypeSet *)0x0;
    if (local_a1) {
      this_local = (GlobOptBlockData *)0x0;
    }
    else {
      bVar1 = JsTypeValueInfo::GetIsShared(toValueInfo);
      if (bVar1) {
        this_local = (GlobOptBlockData *)
                     JsTypeValueInfo::New(this->globOpt->alloc,(JITTypeHolder)toTypeSet,local_60);
        uVar2 = Func::GetSourceContextId(this->globOpt->func);
        uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar2,uVar3);
        if (!bVar1) {
          uVar2 = Func::GetSourceContextId(this->globOpt->func);
          uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
          bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar2,uVar3);
          if (!bVar1) {
            return (JsTypeValueInfo *)this_local;
          }
        }
        bVar1 = JsTypeValueInfo::GetIsShared((JsTypeValueInfo *)this_local);
        Output::Print(L"\n    result (shared %d): ",(ulong)bVar1);
        ValueInfo::Dump((ValueInfo *)this_local);
        Output::Print(L"\n");
      }
      else {
        JsTypeValueInfo::SetJsType(toValueInfo,(JITTypeHolder)toTypeSet);
        JsTypeValueInfo::SetJsTypeSet(toValueInfo,local_60);
        uVar2 = Func::GetSourceContextId(this->globOpt->func);
        uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
        bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,ObjTypeSpecPhase,uVar2,uVar3);
        if (!bVar1) {
          uVar2 = Func::GetSourceContextId(this->globOpt->func);
          uVar3 = Func::GetLocalFunctionId(this->globOpt->func);
          bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase,uVar2,uVar3);
          if (!bVar1) {
            return toValueInfo;
          }
        }
        bVar1 = JsTypeValueInfo::GetIsShared(toValueInfo);
        Output::Print(L"\n    result (shared %d): ",(ulong)bVar1);
        ValueInfo::Dump(&toValueInfo->super_ValueInfo);
        Output::Print(L"\n");
      }
    }
  }
  return (JsTypeValueInfo *)this_local;
}

Assistant:

JsTypeValueInfo*
GlobOptBlockData::MergeJsTypeValueInfo(JsTypeValueInfo * toValueInfo, JsTypeValueInfo * fromValueInfo, bool isLoopBackEdge, bool sameValueNumber)
{
    // On loop back edges we must be conservative and only consider type values which are invariant throughout the loop.
    // That's because in dead store pass we can't correctly track object pointer assignments (o = p), and we may not
    // be able to register correct type checks for the right properties upstream. If we ever figure out how to enhance
    // the dead store pass to track this info we could go more aggressively, as below.
    if (isLoopBackEdge && !sameValueNumber)
    {
        return nullptr;
    }

    if (toValueInfo == fromValueInfo)
    {
        return toValueInfo;
    }

    const JITTypeHolder toType = toValueInfo->GetJsType();
    const JITTypeHolder fromType = fromValueInfo->GetJsType();
    const JITTypeHolder mergedType = toType == fromType ? toType : JITTypeHolder(nullptr);

    Js::EquivalentTypeSet* toTypeSet = toValueInfo->GetJsTypeSet();
    Js::EquivalentTypeSet* fromTypeSet = fromValueInfo->GetJsTypeSet();
    Js::EquivalentTypeSet* mergedTypeSet = (toTypeSet != nullptr && fromTypeSet != nullptr && Js::EquivalentTypeSet::AreIdentical(toTypeSet, fromTypeSet)) ? toTypeSet : nullptr;

#if DBG_DUMP
    if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
    {
        Output::Print(_u("ObjTypeSpec: Merging type value info:\n"));
        Output::Print(_u("    from (shared %d): "), fromValueInfo->GetIsShared());
        fromValueInfo->Dump();
        Output::Print(_u("\n    to (shared %d): "), toValueInfo->GetIsShared());
        toValueInfo->Dump();
    }
#endif

    if (mergedType == toType && mergedTypeSet == toTypeSet)
    {
#if DBG_DUMP
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
        {
            Output::Print(_u("\n    result (shared %d): "), toValueInfo->GetIsShared());
            toValueInfo->Dump();
            Output::Print(_u("\n"));
        }
#endif
        return toValueInfo;
    }

    if (mergedType == nullptr && mergedTypeSet == nullptr)
    {
        // No info, so don't bother making a value.
        return nullptr;
    }

    if (toValueInfo->GetIsShared())
    {
        JsTypeValueInfo* mergedValueInfo = JsTypeValueInfo::New(this->globOpt->alloc, mergedType, mergedTypeSet);
#if DBG_DUMP
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
        {
            Output::Print(_u("\n    result (shared %d): "), mergedValueInfo->GetIsShared());
            mergedValueInfo->Dump();
            Output::Print(_u("\n"));
        }
#endif
        return mergedValueInfo;
    }
    else
    {
        toValueInfo->SetJsType(mergedType);
        toValueInfo->SetJsTypeSet(mergedTypeSet);
#if DBG_DUMP
        if (PHASE_TRACE(Js::ObjTypeSpecPhase, this->globOpt->func) || PHASE_TRACE(Js::EquivObjTypeSpecPhase, this->globOpt->func))
        {
            Output::Print(_u("\n    result (shared %d): "), toValueInfo->GetIsShared());
            toValueInfo->Dump();
            Output::Print(_u("\n"));
        }
#endif
        return toValueInfo;
    }
}